

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintSExpression::visitDataSegment(PrintSExpression *this,DataSegment *curr)

{
  String *this_00;
  Index IVar1;
  size_type sVar2;
  reference this_01;
  pointer other;
  char *__str;
  ostream *poVar3;
  PrintSExpression *in_RCX;
  Name *this_02;
  bool bVar4;
  string_view str;
  basic_string_view<char,_std::char_traits<char>_> local_138 [2];
  Measurer local_118;
  byte local_29;
  undefined1 auStack_28 [7];
  bool needExplicitOffset;
  DataSegment *local_18;
  DataSegment *curr_local;
  PrintSExpression *this_local;
  
  if (((curr->isPassive & 1U) == 0) && (curr->offset == (Expression *)0x0)) {
    return;
  }
  local_18 = curr;
  curr_local = (DataSegment *)this;
  doIndent(this->o,this->indent);
  std::operator<<(this->o,'(');
  poVar3 = this->o;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28,"data ");
  printMajor(poVar3,_auStack_28);
  wasm::Name::print((Name *)local_18,this->o);
  std::operator<<(this->o,' ');
  if ((local_18->isPassive & 1U) != 0) goto LAB_02034818;
  bVar4 = true;
  in_RCX = this;
  if (this->currModule != (Module *)0x0) {
    sVar2 = std::
            vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ::size(&this->currModule->memories);
    bVar4 = sVar2 != 0;
  }
  if (!bVar4) {
    __assert_fail("!currModule || currModule->memories.size() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                  ,0xd48,"void wasm::PrintSExpression::visitDataSegment(DataSegment *)");
  }
  if (this->currModule == (Module *)0x0) {
LAB_0203469e:
    std::operator<<(this->o,"(memory ");
    wasm::Name::print(&local_18->memory,this->o);
    std::operator<<(this->o,") ");
  }
  else {
    this_02 = &local_18->memory;
    in_RCX = (PrintSExpression *)this_02;
    this_01 = std::
              vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ::operator[](&this->currModule->memories,0);
    other = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(this_01);
    bVar4 = IString::operator!=(&this_02->super_IString,(IString *)other);
    if (bVar4) goto LAB_0203469e;
  }
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.flexible
  .
  super__Vector_base<wasm::Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>::Task,_std::allocator<wasm::Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.currFunction =
       (Function *)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.flexible
  .
  super__Vector_base<wasm::Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>::Task,_std::allocator<wasm::Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.flexible
  .
  super__Vector_base<wasm::Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>::Task,_std::allocator<wasm::Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
  _M_elems[9].func = (TaskFunc)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
  _M_elems[9].currp = (Expression **)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
  _M_elems[8].func = (TaskFunc)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
  _M_elems[8].currp = (Expression **)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
  _M_elems[7].func = (TaskFunc)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
  _M_elems[7].currp = (Expression **)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
  _M_elems[6].func = (TaskFunc)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
  _M_elems[6].currp = (Expression **)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
  _M_elems[5].func = (TaskFunc)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
  _M_elems[5].currp = (Expression **)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
  _M_elems[4].func = (TaskFunc)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
  _M_elems[4].currp = (Expression **)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
  _M_elems[3].func = (TaskFunc)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
  _M_elems[3].currp = (Expression **)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
  _M_elems[2].func = (TaskFunc)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
  _M_elems[2].currp = (Expression **)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
  _M_elems[1].func = (TaskFunc)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
  _M_elems[1].currp = (Expression **)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
  _M_elems[0].func = (TaskFunc)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.fixed.
  _M_elems[0].currp = (Expression **)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.replacep =
       (Expression **)0x0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.stack.
  usedFixed = 0;
  local_118.super_PostWalker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.
  super_Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>.currModule =
       (Module *)0x0;
  Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>::Walker
            ((Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_> *)
             &local_118);
  local_118.size = 0;
  IVar1 = Measurer::measure(local_18->offset);
  bVar4 = 1 < IVar1;
  Measurer::~Measurer(&local_118);
  local_29 = bVar4;
  if (bVar4) {
    std::operator<<(this->o,"(offset ");
  }
  visit(this,local_18->offset);
  if ((local_29 & 1) != 0) {
    std::operator<<(this->o,")");
  }
  std::operator<<(this->o,' ');
LAB_02034818:
  this_00 = (String *)this->o;
  __str = std::vector<char,_std::allocator<char>_>::data(&local_18->data);
  sVar2 = std::vector<char,_std::allocator<char>_>::size(&local_18->data);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_138,__str,sVar2);
  str._M_str = (char *)in_RCX;
  str._M_len = (size_t)local_138[0]._M_str;
  String::printEscaped(this_00,(ostream *)local_138[0]._M_len,str);
  poVar3 = std::operator<<(this->o,')');
  std::operator<<(poVar3,this->maybeNewLine);
  return;
}

Assistant:

void PrintSExpression::visitDataSegment(DataSegment* curr) {
  if (!curr->isPassive && !curr->offset) {
    // This data segment must have been created from the datacount section but
    // not parsed yet. Skip it.
    return;
  }
  doIndent(o, indent);
  o << '(';
  printMajor(o, "data ");
  curr->name.print(o);
  o << ' ';
  if (!curr->isPassive) {
    assert(!currModule || currModule->memories.size() > 0);
    if (!currModule || curr->memory != currModule->memories[0]->name) {
      o << "(memory ";
      curr->memory.print(o);
      o << ") ";
    }
    bool needExplicitOffset = Measurer{}.measure(curr->offset) > 1;
    if (needExplicitOffset) {
      o << "(offset ";
    }
    visit(curr->offset);
    if (needExplicitOffset) {
      o << ")";
    }
    o << ' ';
  }
  String::printEscaped(o, {curr->data.data(), curr->data.size()});
  o << ')' << maybeNewLine;
}